

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int try_lift(monst *mtmp,trap *ttmp,int wt,boolean stuff)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  
  iVar1 = weight_cap();
  iVar9 = 1;
  if (2 < (wt * 2) / iVar1) {
    pcVar4 = Monnam(mtmp);
    pcVar8 = "carrying too much";
    if (stuff == '\0') {
      pcVar8 = "too heavy";
    }
    iVar1 = 0;
    pline("%s is %s for you to lift.",pcVar4,pcVar8);
    iVar9 = 0;
    if ((((-1 < (char)ttmp->field_0x8) &&
         (iVar9 = iVar1, (*(uint *)&mtmp->field_0x60 & 0x440000) == 0x40000)) &&
        ((mtmp->data->mflags1 & 0x10000) == 0)) && (mtmp->data->mlet != '5')) {
      uVar2 = mt_random();
      uVar2 = uVar2 % 10;
      lVar6 = (long)u.uluck;
      lVar5 = (long)u.moreluck;
      if ((int)(lVar5 + lVar6) != 0) {
        uVar3 = mt_random();
        if (SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar5 + lVar6)),0) != 0) {
          iVar7 = (int)u.moreluck + (int)u.uluck;
          iVar1 = iVar7 / 3;
          if (iVar7 < -5) {
            iVar1 = iVar7;
          }
          uVar3 = uVar2 - iVar1;
          uVar2 = 0;
          if ((-1 < (int)uVar3) && (uVar2 = 9, (int)uVar3 < 9)) {
            uVar2 = uVar3;
          }
        }
      }
      if ((int)uVar2 < 3) {
        mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
        set_malign(mtmp);
        pcVar4 = Monnam(mtmp);
        iVar9 = 0;
        pline("%s thinks it was nice of you to try.",pcVar4);
      }
    }
  }
  return iVar9;
}

Assistant:

static int try_lift(struct monst *mtmp, struct trap *ttmp, int wt, boolean stuff)
{
	int wc = weight_cap();

	if (((wt * 2) / wc) >= HVY_ENCUMBER) {
	    pline("%s is %s for you to lift.", Monnam(mtmp),
		  stuff ? "carrying too much" : "too heavy");
	    if (!ttmp->madeby_u && !mtmp->mpeaceful && mtmp->mcanmove &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN && rnl(10) < 3) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);		/* reset alignment */
		pline("%s thinks it was nice of you to try.", Monnam(mtmp));
	    }
	    return 0;
	}
	return 1;
}